

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProcess.cpp
# Opt level: O1

void __thiscall Assimp::BaseProcess::ExecuteOnScene(BaseProcess *this,Importer *pImp)

{
  ProgressHandler *pPVar1;
  
  if ((pImp != (Importer *)0x0) && (pImp->pimpl->mScene != (aiScene *)0x0)) {
    pPVar1 = Importer::GetProgressHandler(pImp);
    this->progress = pPVar1;
    if (pPVar1 != (ProgressHandler *)0x0) {
      (*this->_vptr_BaseProcess[4])(this,pImp);
      (*this->_vptr_BaseProcess[5])(this,pImp->pimpl->mScene);
      return;
    }
    __assert_fail("progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseProcess.cpp"
                  ,0x4b,"void Assimp::BaseProcess::ExecuteOnScene(Importer *)");
  }
  __assert_fail("__null != pImp && __null != pImp->Pimpl()->mScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Common/BaseProcess.cpp"
                ,0x48,"void Assimp::BaseProcess::ExecuteOnScene(Importer *)");
}

Assistant:

void BaseProcess::ExecuteOnScene( Importer* pImp)
{
    ai_assert(NULL != pImp && NULL != pImp->Pimpl()->mScene);

    progress = pImp->GetProgressHandler();
    ai_assert(progress);

    SetupProperties( pImp );

    // catch exceptions thrown inside the PostProcess-Step
    try
    {
        Execute(pImp->Pimpl()->mScene);

    } catch( const std::exception& err )    {

        // extract error description
        pImp->Pimpl()->mErrorString = err.what();
        ASSIMP_LOG_ERROR(pImp->Pimpl()->mErrorString);

        // and kill the partially imported data
        delete pImp->Pimpl()->mScene;
        pImp->Pimpl()->mScene = nullptr;
    }
}